

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O0

bool __thiscall
ON_Geometry::GetTightBoundingBox
          (ON_Geometry *this,ON_BoundingBox *tight_bbox,bool bGrowBoxAsInt,ON_Xform *xform)

{
  bool bVar1;
  undefined1 local_78 [8];
  ON_BoundingBox world_bbox;
  ON_3dPointArray corners;
  bool bGrowBox;
  ON_Xform *xform_local;
  bool bGrowBoxAsInt_local;
  ON_BoundingBox *tight_bbox_local;
  ON_Geometry *this_local;
  
  corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ = bGrowBoxAsInt;
  if ((bGrowBoxAsInt) && (bVar1 = ON_BoundingBox::IsValid(tight_bbox), !bVar1)) {
    corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ = 0;
  }
  if ((corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ & 1) == 0) {
    ON_BoundingBox::Destroy(tight_bbox);
  }
  if ((xform == (ON_Xform *)0x0) || (bVar1 = ON_Xform::IsIdentity(xform,0.0), bVar1)) {
    bVar1 = GetBoundingBox(this,tight_bbox,
                           (bool)(corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ & 1));
    if (bVar1) {
      corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ = 1;
    }
  }
  else {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&world_bbox.m_max.z,8);
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_78);
    bVar1 = GetBoundingBox(this,(ON_BoundingBox *)local_78,false);
    if (bVar1) {
      ON_BoundingBox::GetCorners((ON_BoundingBox *)local_78,(ON_3dPointArray *)&world_bbox.m_max.z);
      bVar1 = ON_3dPointArray::GetTightBoundingBox
                        ((ON_3dPointArray *)&world_bbox.m_max.z,tight_bbox,
                         (bool)(corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ & 1),xform
                        );
      if (bVar1) {
        corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ = 1;
      }
    }
    ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)&world_bbox.m_max.z);
  }
  return (bool)(corners.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ & 1);
}

Assistant:

bool ON_Geometry::GetTightBoundingBox( 
	ON_BoundingBox& tight_bbox, 
  bool bGrowBoxAsInt,
	const ON_Xform* xform
  ) const
{
  //	This implementation should be overridden by classes derived
  //  from ON_Geometry
  bool bGrowBox = (0!= bGrowBoxAsInt);
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }

  if ( xform && !xform->IsIdentity() )
  {
    ON_3dPointArray corners(8);
    ON_BoundingBox world_bbox;
    if ( GetBoundingBox(world_bbox,false) )
    {
      world_bbox.GetCorners(corners);
      if ( corners.GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
        bGrowBox = true;
    }
  }
  else
  {
    if ( GetBoundingBox(tight_bbox,bGrowBox) )
      bGrowBox = true;
  }

  return bGrowBox;
}